

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsThermalEngine.cpp
# Opt level: O1

double __thiscall chrono::ChShaftsThermalEngine::ComputeTorque(ChShaftsThermalEngine *this)

{
  double dVar1;
  
  dVar1 = ((this->super_ChShaftsTorqueBase).super_ChShaftsCouple.shaft1)->pos_dt -
          ((this->super_ChShaftsTorqueBase).super_ChShaftsCouple.shaft2)->pos_dt;
  this->error_backward = dVar1 < 0.0;
  (*((this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  return dVar1 * this->throttle;
}

Assistant:

double ChShaftsThermalEngine::ComputeTorque() {
    // COMPUTE THE TORQUE HERE!
    double mw = GetRelativeRotation_dt();

    if (mw < 0)
        error_backward = true;
    else
        error_backward = false;

    // get the actual torque from torque curve
    double mT = Tw->Get_y(mw);

    // modulate it with throttle
    double modulated_T = mT * throttle;

    return modulated_T;
}